

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O1

int __thiscall
FZipExploder::BuildDecoder
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          TableBuilder *values,int numvals)

{
  uchar uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uchar uVar5;
  ulong uVar6;
  
  qsort(values,(long)numvals,4,buildercmp);
  if (0 < numvals) {
    lVar2 = (ulong)(uint)numvals + 1;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = '\0';
    do {
      uVar4 = uVar4 + (uVar3 & 0xffff);
      uVar1 = values[lVar2 + -2].Length;
      uVar3 = uVar3 & 0xffff;
      if (uVar5 != uVar1) {
        uVar3 = 1 << (0x10 - uVar1 & 0x1f);
      }
      values[lVar2 + -2].Code =
           (ushort)""[uVar4 & 0xf] << 0xc | (ushort)""[uVar4 >> 4 & 0xf] << 8 |
           (ushort)""[uVar4 >> 8 & 0xf] << 4 | (ushort)""[uVar4 >> 0xc & 0xf];
      lVar2 = lVar2 + -1;
      uVar5 = uVar1;
    } while (1 < lVar2);
  }
  uVar3 = decoder->Count;
  TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::Grow(decoder,0x100);
  decoder->Count = decoder->Count + 0x100;
  memset(decoder->Array + uVar3,0,0x400);
  if (0 < numvals) {
    uVar6 = 0;
    do {
      InsertCode(this,decoder,0,8,values[uVar6].Code,(uint)values[uVar6].Length,values[uVar6].Value)
      ;
      uVar6 = uVar6 + 1;
    } while ((uint)numvals != uVar6);
  }
  return 0;
}

Assistant:

int FZipExploder::BuildDecoder(TArray<HuffNode> &decoder, TableBuilder *values, int numvals)
{
	int i;

	qsort(values, numvals, sizeof(*values), buildercmp);

	// Generate the Shannon-Fano tree:
	unsigned short code = 0;
	unsigned short code_increment = 0;
	unsigned short last_bit_length = 0;
	for (i = numvals - 1; i >= 0; --i)
	{
		code += code_increment;
		if (values[i].Length != last_bit_length)
		{
			last_bit_length = values[i].Length;
			code_increment = 1 << (16 - last_bit_length);
		}
		// Reverse the order of the bits in the code before storing it.
		values[i].Code = BitReverse4[code >> 12] |
						(BitReverse4[(code >> 8) & 0xf] << 4) |
						(BitReverse4[(code >> 4) & 0xf] << 8) |
						(BitReverse4[code & 0xf] << 12);
	}

	// Insert each code into the hierarchical table. The top level is FIRST_BIT_LEN bits,
	// and the other levels are REST_BIT_LEN bits. If a code does not completely fill
	// a level, every permutation for the remaining bits is filled in to
	// match this one.
	InitTable(decoder, 1 << FIRST_BIT_LEN);		// Set up the top level.
	for (i = 0; i < numvals; ++i)
	{
		InsertCode(decoder, 0, FIRST_BIT_LEN, values[i].Code, values[i].Length, values[i].Value);
	}
	return 0;
}